

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecStr.h
# Opt level: O0

void Vec_StrPutF(Vec_Str_t *vOut,float Val)

{
  undefined1 local_18;
  undefined1 uStack_17;
  undefined1 uStack_16;
  undefined1 uStack_15;
  anon_union_4_2_61e65f1f tmp;
  float Val_local;
  Vec_Str_t *vOut_local;
  
  local_18 = SUB41(Val,0);
  Vec_StrPush(vOut,local_18);
  uStack_17 = (char)((uint)Val >> 8);
  Vec_StrPush(vOut,uStack_17);
  uStack_16 = (char)((uint)Val >> 0x10);
  Vec_StrPush(vOut,uStack_16);
  uStack_15 = (char)((uint)Val >> 0x18);
  Vec_StrPush(vOut,uStack_15);
  return;
}

Assistant:

static inline void Vec_StrPutF( Vec_Str_t * vOut, float Val )
{
    union { float num; unsigned char data[4]; } tmp;
    tmp.num = Val;
    Vec_StrPush( vOut, tmp.data[0] );
    Vec_StrPush( vOut, tmp.data[1] );
    Vec_StrPush( vOut, tmp.data[2] );
    Vec_StrPush( vOut, tmp.data[3] );
}